

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# env_posix.cc
# Opt level: O0

Status __thiscall
leveldb::anon_unknown_1::PosixEnv::NewAppendableFile
          (PosixEnv *this,string *filename,WritableFile **result)

{
  WritableFile **context;
  char *__file;
  int *piVar1;
  PosixWritableFile *this_00;
  undefined8 *in_RCX;
  string local_50 [36];
  int local_2c;
  undefined8 *puStack_28;
  int fd;
  WritableFile **result_local;
  string *filename_local;
  PosixEnv *this_local;
  
  puStack_28 = in_RCX;
  result_local = result;
  filename_local = filename;
  this_local = this;
  __file = (char *)std::__cxx11::string::c_str();
  local_2c = open(__file,0x80441,0x1a4);
  context = result_local;
  if (local_2c < 0) {
    *puStack_28 = 0;
    piVar1 = __errno_location();
    PosixError((anon_unknown_1 *)this,(string *)context,*piVar1);
  }
  else {
    this_00 = (PosixWritableFile *)operator_new(0x10058);
    std::__cxx11::string::string(local_50,(string *)result_local);
    PosixWritableFile::PosixWritableFile(this_00,(string *)local_50,local_2c);
    *puStack_28 = this_00;
    std::__cxx11::string::~string(local_50);
    Status::OK();
  }
  return (Status)(char *)this;
}

Assistant:

Status NewAppendableFile(const std::string& filename,
                           WritableFile** result) override {
    int fd = ::open(filename.c_str(),
                    O_APPEND | O_WRONLY | O_CREAT | kOpenBaseFlags, 0644);
    if (fd < 0) {
      *result = nullptr;
      return PosixError(filename, errno);
    }

    *result = new PosixWritableFile(filename, fd);
    return Status::OK();
  }